

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_result_collector.cpp
# Opt level: O1

unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>,_true>
 __thiscall
duckdb::PhysicalResultCollector::GetResultCollector
          (PhysicalResultCollector *this,ClientContext *context,PreparedStatementData *data)

{
  bool bVar1;
  pointer pPVar2;
  bool *pbVar3;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  
  pPVar2 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
           operator->(&data->physical_plan);
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar2->root);
  bVar1 = PhysicalPlanGenerator::PreserveInsertionOrder(context,(pPVar2->root).ptr);
  if (bVar1) {
    pPVar2 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->(&data->physical_plan);
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar2->root);
    bVar1 = PhysicalPlanGenerator::UseBatchIndex(context,(pPVar2->root).ptr);
    if (bVar1) {
      if (data->is_streaming != false) {
        make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalBufferedBatchCollector,duckdb::PreparedStatementData&>
                  ((duckdb *)this,data);
        return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
                )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
                  )this;
      }
      make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalBatchCollector,duckdb::PreparedStatementData&>
                ((duckdb *)this,data);
      return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
              )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
                )this;
    }
    if (data->is_streaming == false) {
      pbVar3 = &local_2c;
      local_2c = false;
LAB_00bca12b:
      make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalMaterializedCollector,duckdb::PreparedStatementData&,bool>
                ((duckdb *)this,data,pbVar3);
      return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
              )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
                )this;
    }
    pbVar3 = &local_2b;
    local_2b = false;
  }
  else {
    if (data->is_streaming != true) {
      pbVar3 = &local_2a;
      local_2a = true;
      goto LAB_00bca12b;
    }
    pbVar3 = &local_29;
    local_29 = true;
  }
  make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalBufferedCollector,duckdb::PreparedStatementData&,bool>
            ((duckdb *)this,data,pbVar3);
  return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
          )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
            )this;
}

Assistant:

unique_ptr<PhysicalResultCollector> PhysicalResultCollector::GetResultCollector(ClientContext &context,
                                                                                PreparedStatementData &data) {
	if (!PhysicalPlanGenerator::PreserveInsertionOrder(context, data.physical_plan->Root())) {
		// the plan is not order preserving, so we just use the parallel materialized collector
		if (data.is_streaming) {
			return make_uniq_base<PhysicalResultCollector, PhysicalBufferedCollector>(data, true);
		}
		return make_uniq_base<PhysicalResultCollector, PhysicalMaterializedCollector>(data, true);
	} else if (!PhysicalPlanGenerator::UseBatchIndex(context, data.physical_plan->Root())) {
		// the plan is order preserving, but we cannot use the batch index: use a single-threaded result collector
		if (data.is_streaming) {
			return make_uniq_base<PhysicalResultCollector, PhysicalBufferedCollector>(data, false);
		}
		return make_uniq_base<PhysicalResultCollector, PhysicalMaterializedCollector>(data, false);
	} else {
		// we care about maintaining insertion order and the sources all support batch indexes
		// use a batch collector
		if (data.is_streaming) {
			return make_uniq_base<PhysicalResultCollector, PhysicalBufferedBatchCollector>(data);
		}
		return make_uniq_base<PhysicalResultCollector, PhysicalBatchCollector>(data);
	}
}